

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O3

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
          (iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  byte bVar1;
  byte bVar2;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aVar3;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  node_ptr nVar7;
  iterator *piVar8;
  stack_entry *psVar9;
  node_ptr node;
  void *extraout_RDX;
  node_type nVar10;
  byte bVar11;
  ulong uVar12;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar13;
  find_result fVar14;
  undefined1 local_a0 [8];
  iter_result_opt cnxt;
  undefined1 local_78 [8];
  iter_result_opt nxt;
  ulong local_50;
  art_key_type remaining_key;
  key_prefix_snapshot key_prefix;
  
  nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _24_8_ = search_key.field_0;
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  (this->keybuf_).off = 0;
  *match = false;
  node.tagged_ptr = (this->db_->root).tagged_ptr;
  uVar12 = nxt.
           super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
           _24_8_;
  cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _24_8_ = match;
  if (node.tagged_ptr == 0) {
    return this;
  }
  do {
    nVar10 = (node_type)node.tagged_ptr & (I256|I48);
    local_50 = uVar12;
    if ((node.tagged_ptr & 7) == 0) {
      nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
      nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._8_8_ = 0;
      local_78 = (undefined1  [8])node.tagged_ptr;
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
      ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
                ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                  *)&this->stack_,(iter_result<unodb::detail::node_header> *)local_78);
      iVar6 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                        ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)
                         (node.tagged_ptr & 0xfffffffffffffff8),
                         (void *)nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                 ._24_8_,extraout_RDX);
      if (iVar6 == 0) {
        *(undefined1 *)
         cnxt.
         super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
         _24_8_ = 1;
        return this;
      }
      if (fwd) {
        if (iVar6 < 0) {
          return this;
        }
LAB_00116bde:
        piVar8 = next(this);
        return piVar8;
      }
      if (0 < iVar6) {
        return this;
      }
LAB_00116c5d:
      piVar8 = prior(this);
      return piVar8;
    }
    pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               *)(node.tagged_ptr & 0xfffffffffffffff8);
    aVar3.key_bytes._M_elems = (array<std::byte,_8UL>)(pbVar13->k_prefix).u64.value;
    remaining_key.field_0 =
         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)aVar3.key_bytes._M_elems;
    uVar5 = detail::key_prefix_snapshot::get_shared_length
                      ((key_prefix_snapshot *)&remaining_key,uVar12);
    bVar11 = aVar3._7_1_;
    if (uVar5 < bVar11) {
      if (7 < uVar5) {
        __assert_fail("index < sizeof(KeyType)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0x90,
                      "auto unodb::detail::basic_art_key<unsigned long>::operator[](std::size_t) const [KeyType = unsigned long]"
                     );
      }
      if (remaining_key.field_0.key_bytes._M_elems[7] <= uVar5) {
        __assert_fail("i < length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x248,
                      "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
      }
      bVar1 = *(byte *)((long)&local_50 + (ulong)uVar5);
      bVar2 = *(byte *)((long)&remaining_key.field_0 + (ulong)uVar5);
      if (bVar1 == bVar2) {
        __assert_fail("cmp_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x4ce,
                      "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      if (fwd) {
        if (bVar1 < bVar2) {
LAB_00116c41:
          piVar8 = left_most_traversal(this,(node_ptr)node.tagged_ptr);
          return piVar8;
        }
        this = right_most_traversal(this,(node_ptr)node.tagged_ptr);
        goto LAB_00116bde;
      }
      if (bVar2 <= bVar1) {
LAB_00116cb7:
        piVar8 = right_most_traversal(this,(node_ptr)node.tagged_ptr);
        return piVar8;
      }
      this = left_most_traversal(this,(node_ptr)node.tagged_ptr);
      goto LAB_00116c5d;
    }
    if (8 < bVar11) {
      __assert_fail("num_bytes <= sizeof(KeyType)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                    ,0xc3,
                    "void unodb::detail::basic_art_key<unsigned long>::shift_right(const std::size_t) [KeyType = unsigned long]"
                   );
    }
    uVar12 = uVar12 >> ((bVar11 & 7) << 3);
    bVar11 = (byte)uVar12;
    local_50 = uVar12;
    fVar14 = detail::
             basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             ::find_child(pbVar13,nVar10,bVar11);
    if (fVar14.second ==
        (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)0x0)
    {
      if (fwd) {
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::gte_key_byte((iter_result_opt *)local_78,pbVar13,nVar10,bVar11);
        if (nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _M_payload._16_1_ == '\0') {
          if ((this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return this;
          }
          pop(this);
          if ((this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return this;
          }
          while( true ) {
            psVar9 = top(this);
            uVar12 = (psVar9->node).tagged_ptr;
            pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                       *)(uVar12 & 0xfffffffffffffff8);
            nVar10 = (node_type)uVar12;
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::next((iter_result_opt *)local_a0,pbVar13,nVar10 & (I256|I48),psVar9->child_index);
            if (cnxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ == '\x01') break;
            pop(this);
            if ((this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              return this;
            }
          }
          node = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 ::get_child(pbVar13,nVar10 & (I256|I48),psVar9->child_index);
        }
        else {
          uVar4 = nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._M_value.node.tagged_ptr._1_1_;
          nVar7 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar13,nVar10,
                              nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                              ._M_payload._M_value.node.tagged_ptr._1_1_);
          push(this,(node_ptr)node.tagged_ptr,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
               (key_prefix_snapshot)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._8_8_);
          node = nVar7;
        }
        goto LAB_00116c41;
      }
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::lte_key_byte((iter_result_opt *)local_78,pbVar13,nVar10,bVar11);
      if (nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
          _M_payload._16_1_ == '\0') {
        if ((this->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          return this;
        }
        pop(this);
        if ((this->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->stack_).c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          return this;
        }
        while( true ) {
          psVar9 = top(this);
          uVar12 = (psVar9->node).tagged_ptr;
          pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                     *)(uVar12 & 0xfffffffffffffff8);
          nVar10 = (node_type)uVar12;
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::prior((iter_result_opt *)local_a0,pbVar13,nVar10 & (I256|I48),psVar9->child_index);
          if (cnxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _M_payload._16_1_ == '\x01') break;
          pop(this);
          if ((this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            return this;
          }
        }
        node = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::get_child(pbVar13,nVar10 & (I256|I48),psVar9->child_index);
      }
      else {
        uVar4 = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._M_value.node.tagged_ptr._1_1_;
        nVar7 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                ::get_child(pbVar13,nVar10,
                            nxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                            ._M_payload._M_value.node.tagged_ptr._1_1_);
        push(this,(node_ptr)node.tagged_ptr,
             nxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
             _M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
             (key_prefix_snapshot)
             nxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
             _M_payload._8_8_);
        node = nVar7;
      }
      goto LAB_00116cb7;
    }
    push(this,(node_ptr)node.tagged_ptr,bVar11,fVar14.first,
         (key_prefix_snapshot)remaining_key.field_0);
    node.tagged_ptr = ((fVar14.second)->value).tagged_ptr;
    uVar12 = uVar12 >> 8;
  } while( true );
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}